

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O0

void (anonymous_namespace)::test_assignment_from_value<unsigned_int,unsigned_int>(void)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_unsigned_int_&> EVar3;
  int local_5e8;
  value_type_conflict5 local_5e4;
  ExpressionLhs<const_unsigned_int_&> local_5e0;
  SourceLineInfo local_5d0;
  undefined1 local_5a8 [8];
  ResultBuilder __catchResult_1;
  ExpressionLhs<const_unsigned_int_&> local_300 [2];
  SourceLineInfo local_2e0;
  undefined1 local_2b8 [8];
  ResultBuilder __catchResult;
  rational<unsigned_int> local_10;
  rational r;
  
  tcb::rational<unsigned_int>::rational(&local_10,1,10);
  tcb::rational<unsigned_int>::rational<unsigned_int,void>
            ((rational<unsigned_int> *)&__catchResult.m_shouldDebugBreak,3);
  local_10 = (rational<unsigned_int>)__catchResult._664_8_;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x73);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2b8,"REQUIRE",&local_2e0,"r.num() == 3",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_2e0);
    __catchResult_1._668_4_ = tcb::rational<unsigned_int>::num(&local_10);
    EVar3 = Catch::ResultBuilder::operator<=
                      ((ResultBuilder *)local_2b8,(uint *)&__catchResult_1.field_0x29c);
    __catchResult_1.m_shouldDebugBreak = true;
    __catchResult_1.m_shouldThrow = false;
    __catchResult_1._666_2_ = 0;
    local_300[0] = EVar3;
    pRVar2 = Catch::ExpressionLhs<unsigned_int_const&>::operator==
                       ((ExpressionLhs<unsigned_int_const&> *)local_300,
                        (int *)&__catchResult_1.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2b8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2b8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x74);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5a8,"REQUIRE",&local_5d0,"r.denom() == 1",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_5d0);
    local_5e4 = tcb::rational<unsigned_int>::denom(&local_10);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5a8,&local_5e4);
    local_5e8 = 1;
    local_5e0 = EVar3;
    pRVar2 = Catch::ExpressionLhs<unsigned_int_const&>::operator==
                       ((ExpressionLhs<unsigned_int_const&> *)&local_5e0,&local_5e8);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5a8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5a8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5a8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_assignment_from_value()
{
    using rational = tcb::rational<T>;

    rational r{1, 10};
    r = static_cast<U>(3);
    REQUIRE(r.num() == 3);
    REQUIRE(r.denom() == 1);
}